

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearSystem.cpp
# Opt level: O1

void __thiscall
iDynTree::optimalcontrol::LinearSystem::LinearSystem
          (LinearSystem *this,size_t stateSize,size_t controlSize,SparsityStructure *stateSparsity,
          SparsityStructure *controlSparsity)

{
  bool bVar1;
  LinearSystemPimpl *pLVar2;
  MatrixDynSize *pMVar3;
  shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>_> tempControl;
  shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>_> tempState;
  undefined1 local_59;
  TimeInvariantObject<iDynTree::MatrixDynSize> *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  TimeInvariantObject<iDynTree::MatrixDynSize> *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  size_t local_38;
  
  local_38 = controlSize;
  DynamicalSystem::DynamicalSystem(&this->super_DynamicalSystem,stateSize,controlSize);
  (this->super_DynamicalSystem)._vptr_DynamicalSystem = (_func_int **)&PTR__LinearSystem_0019a810;
  pLVar2 = (LinearSystemPimpl *)operator_new(0xf8);
  memset(pLVar2,0,0xf8);
  SparsityStructure::SparsityStructure(&pLVar2->stateSparsity);
  SparsityStructure::SparsityStructure(&pLVar2->controlSparsity);
  this->m_pimpl = pLVar2;
  local_48 = (TimeInvariantObject<iDynTree::MatrixDynSize> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>,std::allocator<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>>>
            (&local_40,&local_48,
             (allocator<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>_> *)
             &local_58);
  pMVar3 = TimeInvariantObject<iDynTree::MatrixDynSize>::get(local_48);
  iDynTree::MatrixDynSize::resize((ulong)pMVar3,stateSize & 0xffffffff);
  TimeInvariantObject<iDynTree::MatrixDynSize>::get(local_48);
  iDynTree::MatrixDynSize::zero();
  pLVar2 = this->m_pimpl;
  (pLVar2->stateMatrix).
  super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = &local_48->super_TimeVaryingObject<iDynTree::MatrixDynSize>;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(pLVar2->stateMatrix).
              super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,&local_40);
  local_58 = (TimeInvariantObject<iDynTree::MatrixDynSize> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>,std::allocator<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>>>
            (&local_50,&local_58,
             (allocator<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>_> *)
             &local_59);
  pMVar3 = TimeInvariantObject<iDynTree::MatrixDynSize>::get(local_58);
  iDynTree::MatrixDynSize::resize((ulong)pMVar3,stateSize & 0xffffffff);
  TimeInvariantObject<iDynTree::MatrixDynSize>::get(local_58);
  iDynTree::MatrixDynSize::zero();
  pLVar2 = this->m_pimpl;
  (pLVar2->controlMatrix).
  super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = &local_58->super_TimeVaryingObject<iDynTree::MatrixDynSize>;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(pLVar2->controlMatrix).
              super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,&local_50);
  pLVar2 = this->m_pimpl;
  pLVar2->hasStateSparsity = false;
  pLVar2->hasControlSparsity = false;
  bVar1 = SparsityStructure::isValid(stateSparsity);
  if (bVar1) {
    pLVar2 = this->m_pimpl;
    pLVar2->hasStateSparsity = true;
    if (&pLVar2->stateSparsity != stateSparsity) {
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&pLVar2->stateSparsity,
                 (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)stateSparsity);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&(pLVar2->stateSparsity).m_nonZeroElementRows,&stateSparsity->m_nonZeroElementRows);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&(pLVar2->stateSparsity).m_nonZeroElementColumns,
               &stateSparsity->m_nonZeroElementColumns);
  }
  bVar1 = SparsityStructure::isValid(controlSparsity);
  if (bVar1) {
    pLVar2 = this->m_pimpl;
    pLVar2->hasControlSparsity = true;
    if (&pLVar2->controlSparsity != controlSparsity) {
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&pLVar2->controlSparsity,
                 (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)controlSparsity);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&(pLVar2->controlSparsity).m_nonZeroElementRows,
               &controlSparsity->m_nonZeroElementRows);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&(pLVar2->controlSparsity).m_nonZeroElementColumns,
               &controlSparsity->m_nonZeroElementColumns);
  }
  if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
  }
  if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
  }
  return;
}

Assistant:

LinearSystem::LinearSystem(size_t stateSize, size_t controlSize, const SparsityStructure &stateSparsity, const SparsityStructure &controlSparsity)
            : DynamicalSystem(stateSize, controlSize)
            , m_pimpl(new LinearSystemPimpl())
        {
            assert(m_pimpl);
            std::shared_ptr<TimeInvariantMatrix> tempState = std::make_shared<TimeInvariantMatrix>();
            tempState->get().resize(static_cast<unsigned int>(stateSize), static_cast<unsigned int>(stateSize));
            tempState->get().zero();
            m_pimpl->stateMatrix = tempState;

            std::shared_ptr<TimeInvariantMatrix> tempControl = std::make_shared<TimeInvariantMatrix>();
            tempControl->get().resize(static_cast<unsigned int>(stateSize), static_cast<unsigned int>(controlSize));
            tempControl->get().zero();
            m_pimpl->controlMatrix = tempControl;

            m_pimpl->hasStateSparsity = false;
            m_pimpl->hasControlSparsity = false;
            if (stateSparsity.isValid()) {
                m_pimpl->hasStateSparsity = true;
                m_pimpl->stateSparsity = stateSparsity;
            }
            if (controlSparsity.isValid()) {
                m_pimpl->hasControlSparsity = true;
                m_pimpl->controlSparsity = controlSparsity;
            }
        }